

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_smi_8_pi7(void)

{
  uint address;
  uint value;
  
  address = m68ki_cpu.dar[0xf];
  m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] + 2;
  value = 0;
  if ((m68ki_cpu.n_flag & 0x80) != 0) {
    value = 0xff;
  }
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,value);
  return;
}

Assistant:

static void m68k_op_smi_8_pi7(void)
{
	m68ki_write_8(EA_A7_PI_8(), COND_MI() ? 0xff : 0);
}